

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
absl::container_internal::
btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
::increment_slow(btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
                 *this)

{
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  bVar1;
  int iVar2;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar3;
  undefined8 uVar4;
  bool bVar5;
  byte bVar6;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar7;
  btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
  *pbVar8;
  char *__function;
  uint i;
  btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_&,_std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_*>
  save;
  int iStack_20;
  
  pbVar8 = this->node_;
  if (((ulong)pbVar8 & 7) == 0) {
    iVar2 = this->position_;
    if (pbVar8[0xb] ==
        (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
         )0x0) {
      if ((int)(uint)(byte)pbVar8[10] <= iVar2) {
        __assert_fail("position_ < node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                      ,0x7d6,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, std::unique_ptr<SeqEntry> &, std::unique_ptr<SeqEntry> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, Reference = std::unique_ptr<SeqEntry> &, Pointer = std::unique_ptr<SeqEntry> *]"
                     );
      }
      i = iVar2 + 1;
      while( true ) {
        pbVar8 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 ::child(pbVar8,i);
        this->node_ = pbVar8;
        if (((ulong)pbVar8 & 7) != 0) break;
        bVar1 = pbVar8[0xb];
        bVar6 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                ::start(pbVar8);
        i = (uint)bVar6;
        if (bVar1 != (btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                      )0x0) {
          this->position_ = i;
          return;
        }
      }
    }
    else {
      if (iVar2 < (int)(uint)(byte)pbVar8[10]) {
        __assert_fail("position_ >= node_->finish()",
                      "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                      ,0x7ca,
                      "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, std::unique_ptr<SeqEntry> &, std::unique_ptr<SeqEntry> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, Reference = std::unique_ptr<SeqEntry> &, Pointer = std::unique_ptr<SeqEntry> *]"
                     );
      }
      pbVar3 = this->node_;
      uVar4 = *(undefined8 *)&this->position_;
      pbVar8 = this->node_;
      while (((ulong)pbVar8 & 7) == 0) {
        if ((this->position_ != (uint)(byte)pbVar8[10]) ||
           (bVar5 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                    ::is_root(pbVar8), bVar5)) {
          if (((ulong)this->node_ & 7) == 0) {
            if (this->position_ != (uint)(byte)this->node_[10]) {
              return;
            }
            iStack_20 = (int)uVar4;
            this->position_ = iStack_20;
            this->node_ = pbVar3;
            return;
          }
          break;
        }
        pbVar8 = this->node_;
        if (((ulong)pbVar8 & 7) != 0) {
          __function = 
          "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 0UL, Char = const char]"
          ;
          goto LAB_0013ed8d;
        }
        pbVar7 = btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                 ::child(*(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                           **)pbVar8,(uint)(byte)pbVar8[8]);
        pbVar8 = this->node_;
        if (pbVar7 != pbVar8) {
          __assert_fail("node_->parent()->child(node_->position()) == node_",
                        "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/btree.h"
                        ,0x7cd,
                        "void absl::container_internal::btree_iterator<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, std::unique_ptr<SeqEntry> &, std::unique_ptr<SeqEntry> *>::increment_slow() [Node = absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>>, Reference = std::unique_ptr<SeqEntry> &, Pointer = std::unique_ptr<SeqEntry> *]"
                       );
        }
        if (((ulong)pbVar8 & 7) != 0) break;
        this->position_ = (uint)(byte)pbVar8[8];
        pbVar8 = *(btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>,_compare_ptr,_std::allocator<std::unique_ptr<SeqEntry,_std::default_delete<SeqEntry>_>_>,_256,_true>_>
                   **)pbVar8;
        this->node_ = pbVar8;
      }
    }
  }
  __function = 
  "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>>::Pointer(Char *) const [Elements = std::tuple<absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *, unsigned int, unsigned char, std::unique_ptr<SeqEntry>, absl::container_internal::btree_node<absl::container_internal::set_params<std::unique_ptr<SeqEntry>, compare_ptr, std::allocator<std::unique_ptr<SeqEntry>>, 256, true>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3, 4>, N = 2UL, Char = const char]"
  ;
LAB_0013ed8d:
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/MW55[P]DNA-Aeon/abseil-cpp/absl/container/internal/layout.h"
                ,0x1e3,__function);
}

Assistant:

void btree_iterator<N, R, P>::increment_slow() {
  if (node_->is_leaf()) {
    assert(position_ >= node_->finish());
    btree_iterator save(*this);
    while (position_ == node_->finish() && !node_->is_root()) {
      assert(node_->parent()->child(node_->position()) == node_);
      position_ = node_->position();
      node_ = node_->parent();
    }
    // TODO(ezb): assert we aren't incrementing end() instead of handling.
    if (position_ == node_->finish()) {
      *this = save;
    }
  } else {
    assert(position_ < node_->finish());
    node_ = node_->child(position_ + 1);
    while (node_->is_internal()) {
      node_ = node_->start_child();
    }
    position_ = node_->start();
  }
}